

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_32f1a0::PointerToMemberType::printLeft(PointerToMemberType *this,OutputStream *s)

{
  bool bVar1;
  StringView local_48;
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *s_local;
  PointerToMemberType *this_local;
  
  local_18 = s;
  s_local = (OutputStream *)this;
  (*this->MemberType->_vptr_Node[4])(this->MemberType,s);
  bVar1 = Node::hasArray(this->MemberType,local_18);
  if (!bVar1) {
    bVar1 = Node::hasFunction(this->MemberType,local_18);
    if (!bVar1) {
      StringView::StringView(&local_38," ");
      OutputStream::operator+=(local_18,local_38);
      goto LAB_002cbaa6;
    }
  }
  StringView::StringView(&local_28,"(");
  OutputStream::operator+=(local_18,local_28);
LAB_002cbaa6:
  Node::print(this->ClassType,local_18);
  StringView::StringView(&local_48,"::*");
  OutputStream::operator+=(local_18,local_48);
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    MemberType->printLeft(s);
    if (MemberType->hasArray(s) || MemberType->hasFunction(s))
      s += "(";
    else
      s += " ";
    ClassType->print(s);
    s += "::*";
  }